

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecker.c
# Opt level: O1

void typecheck_var_assignment
               (CompilerState *compiler_state,VariableType *var_type,AstNode *expr,
               StringObject *var_name)

{
  ravitype_t rVar1;
  int iVar2;
  ravitype_t rVar3;
  char *pcVar4;
  char acStack_128 [256];
  
  rVar1 = var_type->type_code;
  if (rVar1 == RAVI_TANY) {
    return;
  }
  if (var_name == (StringObject *)0x0) {
    pcVar4 = "unknown-TODO";
  }
  else {
    pcVar4 = var_name->str;
  }
  rVar3 = (expr->field_2).common_expr.type.type_code;
  if (rVar3 == RAVI_TANY) {
    return;
  }
  switch((uint)(rVar1 + ~RAVI_TBOOLEAN) >> 3 | rVar1 << 0x1d) {
  case ~RAVI_TANY:
    if (rVar3 == RAVI_TNUMFLT) {
      return;
    }
    if (expr->type == EXPR_UNARY) {
      if (rVar3 == RAVI_TNUMINT) {
        return;
      }
      if ((expr->field_2).unary_expr.unary_op == UNOPR_LEN) {
        return;
      }
    }
    else if (rVar3 == RAVI_TNUMINT) {
      return;
    }
    goto LAB_00116134;
  case RAVI_TNIL:
    if (rVar3 == RAVI_TNUMINT) {
      return;
    }
    if (rVar3 == RAVI_TNUMFLT) {
      return;
    }
    goto LAB_00116134;
  case RAVI_TFALSE|RAVI_TNIL:
    if ((rVar3 == RAVI_TTABLE) && (expr->type == EXPR_TABLE_LITERAL)) {
      rVar3 = RAVI_TARRAYINT;
      rVar1 = RAVI_TARRAYINT;
      if ((expr->field_2).table_expr.inferred_type_code != RAVI_TARRAYINT) {
LAB_001160ed:
        rVar3 = rVar1;
        iVar2 = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr);
        if (iVar2 != 0) break;
      }
LAB_001160fa:
      (expr->field_2).common_expr.type.type_code = rVar3;
    }
    break;
  case RAVI_TBOOLEAN:
    if ((rVar3 == RAVI_TTABLE) && (expr->type == EXPR_TABLE_LITERAL)) {
      rVar3 = RAVI_TARRAYFLT;
      rVar1 = RAVI_TARRAYFLT;
      if ((expr->field_2).table_expr.inferred_type_code != RAVI_TARRAYFLT) goto LAB_001160ed;
      goto LAB_001160fa;
    }
  }
  rVar1 = (expr->field_2).common_expr.type.type_code;
  if (((rVar1 == RAVI_TNIL) && ((var_type->type_code & RAVI_TNIL) != ~RAVI_TANY)) ||
     ((var_type->type_code == rVar1 && (var_type->type_name == (expr->field_2).goto_stmt.name)))) {
    return;
  }
LAB_00116134:
  snprintf(acStack_128,0x100,"%d: Assignment to local symbol %s is not type compatible\n",
           (ulong)expr->line_number,pcVar4);
  raviX_buffer_add_string(&compiler_state->error_message,acStack_128);
  longjmp((__jmp_buf_tag *)compiler_state->env,1);
}

Assistant:

static void typecheck_var_assignment(CompilerState *compiler_state, VariableType *var_type, AstNode *expr,
				     const StringObject *var_name)
{
	if (var_type->type_code == RAVI_TANY)
		// Any value can be assigned to type ANY
		return;
	const char *variable_name = var_name ? var_name->str : "unknown-TODO";
	VariableType *expr_type = &expr->common_expr.type;

	// If expr is ANY type then allow it as a runtime check will be
	// done
	if (expr_type->type_code == RAVI_TANY) {
		return;
	}

	if (var_type->type_code == RAVI_TNUMINT) {
		/* if the expr is of type number or # operator then insert @integer operator */
		if (expr_type->type_code == RAVI_TNUMFLT ||
		    (expr->type == EXPR_UNARY && expr->unary_expr.unary_op == UNOPR_LEN)) {
			/* Okay, but backend must do appropriate conversion */
			;
		} else if (expr_type->type_code != RAVI_TNUMINT) {
			char tempbuf[256];
			snprintf(tempbuf, sizeof tempbuf, "%d: Assignment to local symbol %s is not type compatible\n",
				 expr->line_number, variable_name);
			handle_error(compiler_state, tempbuf);
		}
		return;
	}
	if (var_type->type_code == RAVI_TNUMFLT) {
		if (expr_type->type_code == RAVI_TNUMINT) {
			/* Okay, but backend must do appropriate conversion */
			;
		} else if (expr_type->type_code != RAVI_TNUMFLT) {
			char tempbuf[256];
			snprintf(tempbuf, sizeof tempbuf, "%d: Assignment to local symbol %s is not type compatible\n",
				 expr->line_number, variable_name);
			handle_error(compiler_state, tempbuf);
		}
		return;
	}
	if (var_type->type_code == RAVI_TARRAYFLT) {
		if (expr->type == EXPR_TABLE_LITERAL && expr_type->type_code == RAVI_TTABLE &&
		    (expr->table_expr.inferred_type_code == RAVI_TARRAYFLT ||
		     raviX_ptrlist_size((PtrList *)expr->table_expr.expr_list) == 0)) {
			// Note following updates the AST node too
			expr_type->type_code = RAVI_TARRAYFLT;
		}
	} else if (var_type->type_code == RAVI_TARRAYINT) {
		if (expr->type == EXPR_TABLE_LITERAL && expr_type->type_code == RAVI_TTABLE &&
		    (expr->table_expr.inferred_type_code == RAVI_TARRAYINT ||
		     raviX_ptrlist_size((PtrList *)expr->table_expr.expr_list) == 0)) {
			// Note following updates the AST node too
			expr_type->type_code = RAVI_TARRAYINT;
		}
	}
	if (expr_type->type_code == RAVI_TNIL && (var_type->type_code & RAVI_TM_NIL) != 0) {
		// NILable type so allow nil
		return;
	}
	// all other types must strictly match
	if (!is_type_same(var_type, expr_type)) { // We should probably check type convert-ability here
		char tempbuf[256];
		snprintf(tempbuf, sizeof tempbuf, "%d: Assignment to local symbol %s is not type compatible\n",
			 expr->line_number, variable_name);
		handle_error(compiler_state, tempbuf);
	}
}